

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.h
# Opt level: O2

void __thiscall despot::History::Add(History *this,ACT_TYPE action,OBS_TYPE obs)

{
  ACT_TYPE local_1c;
  OBS_TYPE local_18;
  
  local_1c = action;
  local_18 = obs;
  std::vector<int,_std::allocator<int>_>::push_back(&this->actions_,&local_1c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->observations_,&local_18);
  return;
}

Assistant:

void Add(ACT_TYPE action, OBS_TYPE obs) {
		actions_.push_back(action);
		observations_.push_back(obs);
	}